

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O1

void irr::executeBlit_ColorAlpha_16_to_16(SBlitJob *job)

{
  uint uVar1;
  u32 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  u32 uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar1 = job->argb;
  uVar5 = (uVar1 >> 0x18) - ((int)uVar1 >> 0x1f);
  if ((7 < uVar5) && (uVar2 = job->height, uVar2 != 0)) {
    uVar5 = uVar5 >> 3;
    pvVar7 = job->dst;
    uVar3 = job->width;
    uVar4 = job->dstPitch;
    uVar8 = 0;
    do {
      if ((ulong)uVar3 != 0) {
        uVar9 = 0;
        do {
          uVar6 = (uint)*(ushort *)((long)pvVar7 + uVar9 * 2);
          uVar10 = uVar6 & 0x7c1f;
          uVar6 = uVar6 & 0x3e0;
          *(ushort *)((long)pvVar7 + uVar9 * 2) =
               (short)(((uVar1 >> 6 & 0x3e0) - uVar6) * uVar5 >> 5) + (short)uVar6 & 0x3e0U |
               (short)(((uVar1 >> 9 & 0x7c00 | uVar1 >> 3 & 0x1f) - uVar10) * uVar5 >> 5) +
               (short)uVar10 & 0x7c1fU;
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
      pvVar7 = (void *)((long)pvVar7 + (ulong)uVar4);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  return;
}

Assistant:

static void executeBlit_ColorAlpha_16_to_16(const SBlitJob *job)
{
	u16 *dst = (u16 *)job->dst;

	const u16 alpha = extractAlpha(job->argb) >> 3;
	if (0 == alpha)
		return;
	const u32 src = video::A8R8G8B8toA1R5G5B5(job->argb);

	for (u32 dy = 0; dy != job->height; ++dy) {
		for (u32 dx = 0; dx != job->width; ++dx) {
			dst[dx] = PixelBlend16(dst[dx], src, alpha);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}